

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrittenFontCFF.cpp
# Opt level: O2

EStatusCode __thiscall WrittenFontCFF::WriteFontDefinition(WrittenFontCFF *this,bool inEmbedFont)

{
  WrittenFontRepresentation *pWVar1;
  EStatusCode EVar2;
  Trace *pTVar3;
  CFFDescendentFontWriter descendentFontWriter;
  CFFANSIFontWriter fontWriter;
  CFFDescendentFontWriter local_60;
  CIDFontWriter local_50;
  
  pWVar1 = (this->super_AbstractWrittenFont).mANSIRepresentation;
  if (((pWVar1 != (WrittenFontRepresentation *)0x0) &&
      ((pWVar1->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) &&
     (pWVar1->mWrittenObjectID != 0)) {
    CFFANSIFontWriter::CFFANSIFontWriter((CFFANSIFontWriter *)&local_50);
    EVar2 = CFFANSIFontWriter::WriteFont
                      ((CFFANSIFontWriter *)&local_50,(this->super_AbstractWrittenFont).mFontInfo,
                       (this->super_AbstractWrittenFont).mANSIRepresentation,
                       (this->super_AbstractWrittenFont).mObjectsContext,inEmbedFont);
    if (EVar2 != eSuccess) {
      pTVar3 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar3,
                        "WrittenFontCFF::WriteFontDefinition, Failed to write Ansi font definition")
      ;
      CFFANSIFontWriter::~CFFANSIFontWriter((CFFANSIFontWriter *)&local_50);
      return EVar2;
    }
    CFFANSIFontWriter::~CFFANSIFontWriter((CFFANSIFontWriter *)&local_50);
  }
  pWVar1 = (this->super_AbstractWrittenFont).mCIDRepresentation;
  EVar2 = eSuccess;
  if (((pWVar1 != (WrittenFontRepresentation *)0x0) &&
      ((pWVar1->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) &&
     (pWVar1->mWrittenObjectID != 0)) {
    CIDFontWriter::CIDFontWriter(&local_50);
    CFFDescendentFontWriter::CFFDescendentFontWriter(&local_60);
    EVar2 = CIDFontWriter::WriteFont
                      (&local_50,(this->super_AbstractWrittenFont).mFontInfo,
                       (this->super_AbstractWrittenFont).mCIDRepresentation,
                       (this->super_AbstractWrittenFont).mObjectsContext,
                       &local_60.super_IDescendentFontWriter,inEmbedFont);
    if (EVar2 != eSuccess) {
      pTVar3 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar3,
                        "WrittenFontCFF::WriteFontDefinition, Failed to write CID font definition");
    }
    CFFDescendentFontWriter::~CFFDescendentFontWriter(&local_60);
    CIDFontWriter::~CIDFontWriter(&local_50);
  }
  return EVar2;
}

Assistant:

EStatusCode WrittenFontCFF::WriteFontDefinition(bool inEmbedFont)
{
	EStatusCode status = PDFHummus::eSuccess;
	do
	{
		if(mANSIRepresentation && !mANSIRepresentation->isEmpty() && mANSIRepresentation->mWrittenObjectID != 0)
		{
			CFFANSIFontWriter fontWriter;

			status = fontWriter.WriteFont(*mFontInfo, mANSIRepresentation, mObjectsContext, inEmbedFont);
			if(status != PDFHummus::eSuccess)
			{
				TRACE_LOG("WrittenFontCFF::WriteFontDefinition, Failed to write Ansi font definition");
				break;

			}
		}

		if(mCIDRepresentation && !mCIDRepresentation->isEmpty()  && mCIDRepresentation->mWrittenObjectID != 0)
		{
			CIDFontWriter fontWriter;
			CFFDescendentFontWriter descendentFontWriter;

			status = fontWriter.WriteFont(*mFontInfo, mCIDRepresentation, mObjectsContext, &descendentFontWriter, inEmbedFont);
			if(status != PDFHummus::eSuccess)
			{
				TRACE_LOG("WrittenFontCFF::WriteFontDefinition, Failed to write CID font definition");
				break;
			}
		}

	} while(false);

	return status;
}